

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  ImGuiItemFlags *pIVar1;
  ImGuiWindow *pIVar2;
  undefined7 in_register_00000031;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    pIVar1 = &(pIVar2->DC).ItemFlags;
    *pIVar1 = *pIVar1 & ~option;
  }
  else {
    pIVar1 = &(pIVar2->DC).ItemFlags;
    *pIVar1 = *pIVar1 | option;
  }
  ImVector<int>::push_back(&(pIVar2->DC).ItemFlagsStack,&(pIVar2->DC).ItemFlags);
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (enabled)
        window->DC.ItemFlags |= option;
    else
        window->DC.ItemFlags &= ~option;
    window->DC.ItemFlagsStack.push_back(window->DC.ItemFlags);
}